

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::TextureLayerAttachmentTest::Clean
          (TextureLayerAttachmentTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_fbo != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo);
    this->m_fbo = 0;
  }
  if (this->m_to != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to);
    this->m_to = 0;
  }
  (**(code **)(lVar2 + 0x1c0))(0,0,0,0);
  (**(code **)(lVar2 + 0x1c8))(0x3ff0000000000000);
  (**(code **)(lVar2 + 0x208))(0);
  do {
    iVar1 = (**(code **)(lVar2 + 0x800))();
  } while (iVar1 != 0);
  return;
}

Assistant:

void TextureLayerAttachmentTest::Clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Cleanup. */
	if (m_fbo)
	{
		gl.deleteFramebuffers(1, &m_fbo);

		m_fbo = 0;
	}

	if (m_to)
	{
		gl.deleteTextures(1, &m_to);

		m_to = 0;
	}

	/* Returning to default clear values. */
	gl.clearColor(0.f, 0.f, 0.f, 0.f);
	gl.clearDepth(1.f);
	gl.clearStencil(0);

	/* Errors clean up. */
	while (gl.getError())
		;
}